

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O1

void bitrv2(size_t n,size_t *ip,float *a)

{
  float *pfVar1;
  undefined8 uVar2;
  size_t *psVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  
  *ip = 0;
  if (n < 9) {
    sVar5 = 8;
    uVar4 = 1;
  }
  else {
    uVar6 = 1;
    do {
      n = n >> 1;
      psVar3 = ip;
      for (uVar4 = uVar6; uVar4 != 0; uVar4 = uVar4 - 1) {
        psVar3[uVar6] = *psVar3 + n;
        psVar3 = psVar3 + 1;
      }
      uVar4 = uVar6 * 2;
      sVar5 = uVar6 << 4;
      uVar6 = uVar4;
    } while (sVar5 < n);
  }
  if (sVar5 == n) {
    if (uVar4 != 0) {
      uVar6 = 0;
      do {
        if (uVar6 != 0) {
          sVar5 = ip[uVar6];
          uVar8 = 0;
          do {
            lVar7 = ip[uVar8] + uVar6 * 2;
            pfVar1 = a + sVar5 + uVar8 * 2;
            uVar2 = *(undefined8 *)pfVar1;
            *(undefined8 *)pfVar1 = *(undefined8 *)(a + lVar7);
            *(undefined8 *)(a + lVar7) = uVar2;
            lVar7 = lVar7 + uVar4 * 4;
            uVar2 = *(undefined8 *)(pfVar1 + uVar4 * 2);
            *(undefined8 *)(pfVar1 + uVar4 * 2) = *(undefined8 *)(a + lVar7);
            *(undefined8 *)(a + lVar7) = uVar2;
            lVar7 = lVar7 + uVar4 * -2;
            uVar2 = *(undefined8 *)(pfVar1 + uVar4 * 4);
            *(undefined8 *)(pfVar1 + uVar4 * 4) = *(undefined8 *)(a + lVar7);
            *(undefined8 *)(a + lVar7) = uVar2;
            uVar2 = *(undefined8 *)(pfVar1 + uVar4 * 6);
            *(undefined8 *)(pfVar1 + uVar4 * 6) = *(undefined8 *)(a + uVar4 * 4 + lVar7);
            *(undefined8 *)(a + uVar4 * 4 + lVar7) = uVar2;
            uVar8 = uVar8 + 1;
          } while (uVar6 != uVar8);
        }
        lVar7 = (uVar6 + uVar4) * 2 + ip[uVar6];
        uVar2 = *(undefined8 *)(a + lVar7);
        *(undefined8 *)(a + lVar7) = *(undefined8 *)(a + uVar4 * 2 + lVar7);
        *(undefined8 *)(a + uVar4 * 2 + lVar7) = uVar2;
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar4);
    }
  }
  else if (1 < uVar4) {
    uVar6 = 1;
    do {
      sVar5 = ip[uVar6];
      uVar8 = 0;
      do {
        lVar7 = ip[uVar8] + uVar6 * 2;
        uVar2 = *(undefined8 *)(a + sVar5 + uVar8 * 2);
        *(undefined8 *)(a + sVar5 + uVar8 * 2) = *(undefined8 *)(a + lVar7);
        *(undefined8 *)(a + lVar7) = uVar2;
        uVar2 = *(undefined8 *)(a + uVar4 * 2 + sVar5 + uVar8 * 2);
        *(undefined8 *)(a + uVar4 * 2 + sVar5 + uVar8 * 2) = *(undefined8 *)(a + uVar4 * 2 + lVar7);
        *(undefined8 *)(a + uVar4 * 2 + lVar7) = uVar2;
        uVar8 = uVar8 + 1;
      } while (uVar6 != uVar8);
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar4);
  }
  return;
}

Assistant:

static void bitrv2(size_t n, size_t *ip, float *a)
{
    size_t j, j1, k, k1, l, m, m2;
    float xr, xi, yr, yi;

    ip[0] = 0;
    l = n;
    m = 1;
    while ((m << 3) < l) {
        l >>= 1;
        for (j = 0; j < m; j++) {
            ip[m + j] = ip[j] + l;
        }
        m <<= 1;
    }
    m2 = 2 * m;
    if ((m << 3) == l) {
        for (k = 0; k < m; k++) {
            for (j = 0; j < k; j++) {
                j1 = 2 * j + ip[k];
                k1 = 2 * k + ip[j];
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += 2 * m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 -= m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += 2 * m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
            }
            j1 = 2 * k + m2 + ip[k];
            k1 = j1 + m2;
            xr = a[j1];
            xi = a[j1 + 1];
            yr = a[k1];
            yi = a[k1 + 1];
            a[j1] = yr;
            a[j1 + 1] = yi;
            a[k1] = xr;
            a[k1 + 1] = xi;
        }
    } else {
        for (k = 1; k < m; k++) {
            for (j = 0; j < k; j++) {
                j1 = 2 * j + ip[k];
                k1 = 2 * k + ip[j];
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
            }
        }
    }
}